

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O1

void __thiscall QUndoModel::setStackCurrentIndex(QUndoModel *this,QModelIndex *index)

{
  int iVar1;
  
  if (this->m_stack != (QUndoStack *)0x0) {
    iVar1 = QUndoStack::index();
    if (((((index->r != iVar1) || (index->c != 0)) || (index->i != 0)) ||
        ((QUndoModel *)(index->m).ptr != this)) && (index->c == 0)) {
      QUndoStack::setIndex((int)this->m_stack);
      return;
    }
  }
  return;
}

Assistant:

void QUndoModel::setStackCurrentIndex(const QModelIndex &index)
{
    if (m_stack == nullptr)
        return;

    if (index == selectedIndex())
        return;

    if (index.column() != 0)
        return;

    m_stack->setIndex(index.row());
}